

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

int __thiscall ncnn::Gemm::load_model(Gemm *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *local_70;
  int *local_68;
  size_t local_60;
  int local_58;
  Allocator *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  size_t local_30;
  
  if (this->constantA == 1) {
    if (this->transA == 0) {
      (*mb->_vptr_ModelBin[3])
                (&local_70,mb,(ulong)(uint)this->constantK,(ulong)(uint)this->constantM,0);
      if (&this->A_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->A_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->A_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->A_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->A_data).data = local_70;
        (this->A_data).refcount = local_68;
        (this->A_data).elemsize = local_60;
        (this->A_data).elempack = local_58;
        (this->A_data).allocator = local_50;
        (this->A_data).dims = local_48;
        (this->A_data).w = iStack_44;
        (this->A_data).h = iStack_40;
        (this->A_data).d = iStack_3c;
        (this->A_data).c = local_38;
        (this->A_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) goto LAB_0044aeb8;
          (*local_50->_vptr_Allocator[3])();
        }
      }
    }
    else {
      (*mb->_vptr_ModelBin[3])
                (&local_70,mb,(ulong)(uint)this->constantM,(ulong)(uint)this->constantK,0);
      if (&this->A_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->A_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->A_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->A_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->A_data).data = local_70;
        (this->A_data).refcount = local_68;
        (this->A_data).elemsize = local_60;
        (this->A_data).elempack = local_58;
        (this->A_data).allocator = local_50;
        (this->A_data).dims = local_48;
        (this->A_data).w = iStack_44;
        (this->A_data).h = iStack_40;
        (this->A_data).d = iStack_3c;
        (this->A_data).c = local_38;
        (this->A_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
LAB_0044aeb8:
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((this->A_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->A_data).c * (this->A_data).cstep == 0) {
      return -100;
    }
  }
  if (this->constantB != 1) goto LAB_0044b131;
  if (this->transB == 0) {
    (*mb->_vptr_ModelBin[3])
              (&local_70,mb,(ulong)(uint)this->constantN,(ulong)(uint)this->constantK,0);
    if (&this->B_data != (Mat *)&local_70) {
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + 1;
        UNLOCK();
      }
      piVar1 = (this->B_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pAVar2 = (this->B_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->B_data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->B_data).data = local_70;
      (this->B_data).refcount = local_68;
      (this->B_data).elemsize = local_60;
      (this->B_data).elempack = local_58;
      (this->B_data).allocator = local_50;
      (this->B_data).dims = local_48;
      (this->B_data).w = iStack_44;
      (this->B_data).h = iStack_40;
      (this->B_data).d = iStack_3c;
      (this->B_data).c = local_38;
      (this->B_data).cstep = local_30;
    }
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + -1;
      UNLOCK();
      if (*local_68 == 0) {
        if (local_50 == (Allocator *)0x0) goto LAB_0044b103;
        (*local_50->_vptr_Allocator[3])();
      }
    }
  }
  else {
    (*mb->_vptr_ModelBin[3])
              (&local_70,mb,(ulong)(uint)this->constantK,(ulong)(uint)this->constantN,0);
    if (&this->B_data != (Mat *)&local_70) {
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + 1;
        UNLOCK();
      }
      piVar1 = (this->B_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pAVar2 = (this->B_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->B_data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->B_data).data = local_70;
      (this->B_data).refcount = local_68;
      (this->B_data).elemsize = local_60;
      (this->B_data).elempack = local_58;
      (this->B_data).allocator = local_50;
      (this->B_data).dims = local_48;
      (this->B_data).w = iStack_44;
      (this->B_data).h = iStack_40;
      (this->B_data).d = iStack_3c;
      (this->B_data).c = local_38;
      (this->B_data).cstep = local_30;
    }
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + -1;
      UNLOCK();
      if (*local_68 == 0) {
        if (local_50 == (Allocator *)0x0) {
LAB_0044b103:
          free(local_70);
        }
        else {
          (*local_50->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((this->B_data).data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->B_data).c * (this->B_data).cstep == 0) {
    return -100;
  }
LAB_0044b131:
  if ((this->constantC == 1) && (iVar3 = this->constant_broadcast_type_C, iVar3 != -1)) {
    if (iVar3 == 0) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,1,0);
      if (&this->C_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->C_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->C_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->C_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).data = local_70;
        (this->C_data).refcount = local_68;
        (this->C_data).elemsize = local_60;
        (this->C_data).elempack = local_58;
        (this->C_data).allocator = local_50;
        (this->C_data).dims = local_48;
        (this->C_data).w = iStack_44;
        (this->C_data).h = iStack_40;
        (this->C_data).d = iStack_3c;
        (this->C_data).c = local_38;
        (this->C_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      iVar3 = this->constant_broadcast_type_C;
    }
    if (iVar3 == 1) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->constantM,0);
      if (&this->C_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->C_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->C_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->C_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).data = local_70;
        (this->C_data).refcount = local_68;
        (this->C_data).elemsize = local_60;
        (this->C_data).elempack = local_58;
        (this->C_data).allocator = local_50;
        (this->C_data).dims = local_48;
        (this->C_data).w = iStack_44;
        (this->C_data).h = iStack_40;
        (this->C_data).d = iStack_3c;
        (this->C_data).c = local_38;
        (this->C_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      iVar3 = this->constant_broadcast_type_C;
    }
    if (iVar3 == 2) {
      (*mb->_vptr_ModelBin[3])(&local_70,mb,1,(ulong)(uint)this->constantM,0);
      if (&this->C_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->C_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->C_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->C_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).data = local_70;
        (this->C_data).refcount = local_68;
        (this->C_data).elemsize = local_60;
        (this->C_data).elempack = local_58;
        (this->C_data).allocator = local_50;
        (this->C_data).dims = local_48;
        (this->C_data).w = iStack_44;
        (this->C_data).h = iStack_40;
        (this->C_data).d = iStack_3c;
        (this->C_data).c = local_38;
        (this->C_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      iVar3 = this->constant_broadcast_type_C;
    }
    if (iVar3 == 3) {
      (*mb->_vptr_ModelBin[3])
                (&local_70,mb,(ulong)(uint)this->constantN,(ulong)(uint)this->constantM,0);
      if (&this->C_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->C_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->C_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->C_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).data = local_70;
        (this->C_data).refcount = local_68;
        (this->C_data).elemsize = local_60;
        (this->C_data).elempack = local_58;
        (this->C_data).allocator = local_50;
        (this->C_data).dims = local_48;
        (this->C_data).w = iStack_44;
        (this->C_data).h = iStack_40;
        (this->C_data).d = iStack_3c;
        (this->C_data).c = local_38;
        (this->C_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
      iVar3 = this->constant_broadcast_type_C;
    }
    if (iVar3 == 4) {
      (*mb->_vptr_ModelBin[3])(&local_70,mb,(ulong)(uint)this->constantN,1,0);
      if (&this->C_data != (Mat *)&local_70) {
        if (local_68 != (int *)0x0) {
          LOCK();
          *local_68 = *local_68 + 1;
          UNLOCK();
        }
        piVar1 = (this->C_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->C_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->C_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->C_data).data = local_70;
        (this->C_data).refcount = local_68;
        (this->C_data).elemsize = local_60;
        (this->C_data).elempack = local_58;
        (this->C_data).allocator = local_50;
        (this->C_data).dims = local_48;
        (this->C_data).w = iStack_44;
        (this->C_data).h = iStack_40;
        (this->C_data).d = iStack_3c;
        (this->C_data).c = local_38;
        (this->C_data).cstep = local_30;
      }
      if (local_68 != (int *)0x0) {
        LOCK();
        *local_68 = *local_68 + -1;
        UNLOCK();
        if (*local_68 == 0) {
          if (local_50 == (Allocator *)0x0) {
            free(local_70);
          }
          else {
            (*local_50->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((this->C_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->C_data).c * (this->C_data).cstep == 0) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Gemm::load_model(const ModelBin& mb)
{
    if (constantA == 1)
    {
        if (transA == 0)
            A_data = mb.load(constantK, constantM, 0);
        else
            A_data = mb.load(constantM, constantK, 0);
        if (A_data.empty())
            return -100;
    }

    if (constantB == 1)
    {
        if (transB == 0)
            B_data = mb.load(constantN, constantK, 0);
        else
            B_data = mb.load(constantK, constantN, 0);
        if (B_data.empty())
            return -100;
    }

    if (constantC == 1 && constant_broadcast_type_C != -1)
    {
        if (constant_broadcast_type_C == 0)
            C_data = mb.load(1, 0);
        if (constant_broadcast_type_C == 1)
            C_data = mb.load(constantM, 0);
        if (constant_broadcast_type_C == 2)
            C_data = mb.load(1, constantM, 0);
        if (constant_broadcast_type_C == 3)
            C_data = mb.load(constantN, constantM, 0);
        if (constant_broadcast_type_C == 4)
            C_data = mb.load(constantN, 1, 0);
        if (C_data.empty())
            return -100;
    }

    return 0;
}